

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTPNStm * __thiscall CTcParser::parse_return(CTcParser *this,int *err)

{
  tc_toktyp_t tVar1;
  int iVar2;
  undefined4 *in_RSI;
  CTPNStm *stm;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  CTcTokenizer *in_stack_ffffffffffffffb0;
  CTcTokenizer *in_stack_ffffffffffffffb8;
  CTPNStmReturn *local_20;
  CTPNStmReturn *local_8;
  
  tVar1 = CTcTokenizer::next(in_stack_ffffffffffffffb8);
  if (tVar1 - TOKT_LBRACE < 2) {
    CTcTokenizer::log_error_curtok(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    local_8 = (CTPNStmReturn *)0x0;
  }
  else {
    if (tVar1 == TOKT_SEM) {
      CTcTokenizer::next(in_stack_ffffffffffffffb8);
      local_20 = (CTPNStmReturn *)CTcPrsAllocObj::operator_new(0x2bbd31);
      CTPNStmReturn::CTPNStmReturn
                ((CTPNStmReturn *)in_stack_ffffffffffffffb0,
                 (CTcPrsNode *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
    else {
      local_20 = (CTPNStmReturn *)CTcPrsAllocObj::operator_new(0x2bbda4);
      parse_expr((CTcParser *)0x2bbdb3);
      CTPNStmReturn::CTPNStmReturn
                (local_20,(CTcPrsNode *)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      iVar2 = parse_req_sem();
      if (iVar2 != 0) {
        *in_RSI = 1;
        return (CTPNStm *)0x0;
      }
    }
    local_8 = local_20;
  }
  return (CTPNStm *)local_8;
}

Assistant:

CTPNStm *CTcParser::parse_return(int *err)
{
    CTPNStm *stm;
    
    /* skip the 'return' keyword and see what we have */
    switch(G_tok->next())
    {
    case TOKT_SEM:
        /* 
         *   end of the statement - this is a void return; skip the
         *   semicolon, and return a void return statement node 
         */
        G_tok->next();
        stm = new CTPNStmReturn(0);
        break;

    case TOKT_LBRACE:
    case TOKT_RBRACE:
        /* 
         *   they probably just left out a semicolon - flag the error, and
         *   continue parsing from this token 
         */
        G_tok->log_error_curtok(TCERR_RET_REQ_EXPR);
        return 0;

    default:
        /* it's a return with an expression - parse the expression */
        stm = new CTPNStmReturn(parse_expr());

        /* make sure we're on a semicolon */
        if (parse_req_sem())
        {
            *err = TRUE;
            return 0;
        }

        /* done */
        break;
    }

    /* return the statement node we created */
    return stm;
}